

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  int iVar23;
  long lVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Scene *scene;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  UVIdentity<4> mapUV;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  StackItemT<embree::NodeRefPtr<8>_> *local_26c0;
  ulong local_26b8;
  ulong local_26b0;
  ulong local_26a8;
  ulong local_26a0;
  ulong local_2698;
  ulong local_2690;
  long local_2688;
  long local_2680;
  RTCFilterFunctionNArguments args;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined1 local_2628 [32];
  undefined1 local_2608 [32];
  undefined1 local_25e8 [32];
  undefined1 local_25c8 [32];
  undefined1 local_25a8 [32];
  undefined1 local_2588 [32];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  UVIdentity<4> *local_2538;
  byte local_2530;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  float local_24d8 [4];
  undefined1 local_24c8 [16];
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  RTCHitN local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined1 local_2418 [32];
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  pSVar28 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_2588 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar101 = ZEXT3264(local_2588);
  local_25a8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar102 = ZEXT3264(local_25a8);
  local_25c8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar103 = ZEXT3264(local_25c8);
  local_23b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_25e8 = vbroadcastss_avx512vl(ZEXT416((uint)(local_23b8 * 0.99999964)));
  auVar104 = ZEXT3264(local_25e8);
  local_2608 = vbroadcastss_avx512vl(ZEXT416((uint)(local_23d8 * 0.99999964)));
  auVar105 = ZEXT3264(local_2608);
  local_2628 = vbroadcastss_avx512vl(ZEXT416((uint)(local_23f8 * 0.99999964)));
  auVar106 = ZEXT3264(local_2628);
  local_23b8 = local_23b8 * 1.0000004;
  local_23d8 = local_23d8 * 1.0000004;
  local_23f8 = local_23f8 * 1.0000004;
  local_2690 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2698 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_26a8 = local_2690 ^ 0x20;
  local_26b0 = local_2698 ^ 0x20;
  local_26b8 = local_26a0 ^ 0x20;
  iVar23 = (tray->tnear).field_0.i[k];
  local_2418._4_4_ = iVar23;
  local_2418._0_4_ = iVar23;
  local_2418._8_4_ = iVar23;
  local_2418._12_4_ = iVar23;
  local_2418._16_4_ = iVar23;
  local_2418._20_4_ = iVar23;
  local_2418._24_4_ = iVar23;
  local_2418._28_4_ = iVar23;
  auVar96 = ZEXT3264(local_2418);
  iVar23 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT3264(CONCAT428(iVar23,CONCAT424(iVar23,CONCAT420(iVar23,CONCAT416(iVar23,CONCAT412(
                                                  iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23)))))
                                               )));
  local_24c8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar63 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar98 = ZEXT3264(auVar63);
  auVar100 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  fStack_23b4 = local_23b8;
  fStack_23b0 = local_23b8;
  fStack_23ac = local_23b8;
  fStack_23a8 = local_23b8;
  fStack_23a4 = local_23b8;
  fStack_23a0 = local_23b8;
  fStack_239c = local_23b8;
  fStack_23d4 = local_23d8;
  fStack_23d0 = local_23d8;
  fStack_23cc = local_23d8;
  fStack_23c8 = local_23d8;
  fStack_23c4 = local_23d8;
  fStack_23c0 = local_23d8;
  fStack_23bc = local_23d8;
  fStack_23f4 = local_23f8;
  fStack_23f0 = local_23f8;
  fStack_23ec = local_23f8;
  fStack_23e8 = local_23f8;
  fStack_23e4 = local_23f8;
  fStack_23e0 = local_23f8;
  fStack_23dc = local_23f8;
  uVar30 = local_26a0;
  uVar27 = local_2690;
  uVar36 = local_2698;
  uVar31 = local_26b8;
  uVar32 = local_26a8;
  uVar33 = local_26b0;
  fVar73 = local_23b8;
  fVar74 = local_23b8;
  fVar75 = local_23b8;
  fVar76 = local_23b8;
  fVar77 = local_23b8;
  fVar78 = local_23b8;
  fVar79 = local_23b8;
  fVar80 = local_23d8;
  fVar82 = local_23d8;
  fVar83 = local_23d8;
  fVar84 = local_23d8;
  fVar85 = local_23d8;
  fVar86 = local_23d8;
  fVar87 = local_23d8;
  fVar88 = local_23f8;
  fVar90 = local_23f8;
  fVar91 = local_23f8;
  fVar92 = local_23f8;
  fVar93 = local_23f8;
  fVar94 = local_23f8;
  fVar95 = local_23f8;
  do {
    do {
      do {
        if (pSVar28 == stack) {
          return;
        }
        pSVar22 = pSVar28 + -1;
        pSVar28 = pSVar28 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar22->dist);
      sVar29 = (pSVar28->ptr).ptr;
      do {
        auVar63 = auVar96._0_32_;
        if ((sVar29 & 8) == 0) {
          auVar59 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar27),auVar101._0_32_);
          auVar59 = vmulps_avx512vl(auVar104._0_32_,auVar59);
          auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar36),auVar102._0_32_);
          auVar60 = vmulps_avx512vl(auVar105._0_32_,auVar60);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar30),auVar103._0_32_);
          auVar60 = vmulps_avx512vl(auVar106._0_32_,auVar60);
          auVar60 = vmaxps_avx(auVar60,auVar63);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          in_ZMM15 = ZEXT3264(auVar59);
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar32),auVar101._0_32_);
          auVar60._4_4_ = fVar74 * auVar61._4_4_;
          auVar60._0_4_ = fVar73 * auVar61._0_4_;
          auVar60._8_4_ = fVar75 * auVar61._8_4_;
          auVar60._12_4_ = fVar76 * auVar61._12_4_;
          auVar60._16_4_ = fVar77 * auVar61._16_4_;
          auVar60._20_4_ = fVar78 * auVar61._20_4_;
          auVar60._24_4_ = fVar79 * auVar61._24_4_;
          auVar60._28_4_ = auVar61._28_4_;
          auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar33),auVar102._0_32_);
          auVar61._4_4_ = fVar82 * auVar62._4_4_;
          auVar61._0_4_ = fVar80 * auVar62._0_4_;
          auVar61._8_4_ = fVar83 * auVar62._8_4_;
          auVar61._12_4_ = fVar84 * auVar62._12_4_;
          auVar61._16_4_ = fVar85 * auVar62._16_4_;
          auVar61._20_4_ = fVar86 * auVar62._20_4_;
          auVar61._24_4_ = fVar87 * auVar62._24_4_;
          auVar61._28_4_ = auVar62._28_4_;
          auVar60 = vminps_avx(auVar60,auVar61);
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar29 + 0x40 + uVar31),auVar103._0_32_);
          auVar62._4_4_ = fVar90 * auVar61._4_4_;
          auVar62._0_4_ = fVar88 * auVar61._0_4_;
          auVar62._8_4_ = fVar91 * auVar61._8_4_;
          auVar62._12_4_ = fVar92 * auVar61._12_4_;
          auVar62._16_4_ = fVar93 * auVar61._16_4_;
          auVar62._20_4_ = fVar94 * auVar61._20_4_;
          auVar62._24_4_ = fVar95 * auVar61._24_4_;
          auVar62._28_4_ = auVar61._28_4_;
          auVar61 = vminps_avx(auVar62,auVar68._0_32_);
          auVar60 = vminps_avx(auVar60,auVar61);
          uVar18 = vcmpps_avx512vl(auVar59,auVar60,2);
          root.ptr = CONCAT44((int)(root.ptr >> 0x20),(uint)(byte)uVar18);
        }
        if ((sVar29 & 8) == 0) {
          if (root.ptr == 0) {
            iVar23 = 4;
          }
          else {
            auVar59 = *(undefined1 (*) [32])(sVar29 & 0xfffffffffffffff0);
            auVar60 = ((undefined1 (*) [32])(sVar29 & 0xfffffffffffffff0))[1];
            auVar97 = auVar98._0_32_;
            auVar99 = auVar100._0_32_;
            auVar67 = in_ZMM15._0_32_;
            auVar61 = vpternlogd_avx512vl(auVar97,auVar67,auVar99,0xf8);
            uVar35 = root.ptr & 0xffffffff;
            auVar62 = vpcompressd_avx512vl(auVar61);
            bVar15 = (bool)((byte)uVar35 & 1);
            auVar66._0_4_ = (uint)bVar15 * auVar62._0_4_ | (uint)!bVar15 * auVar61._0_4_;
            bVar15 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar15 * auVar62._4_4_ | (uint)!bVar15 * auVar61._4_4_;
            bVar15 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar15 * auVar62._8_4_ | (uint)!bVar15 * auVar61._8_4_;
            bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
            auVar66._12_4_ = (uint)bVar15 * auVar62._12_4_ | (uint)!bVar15 * auVar61._12_4_;
            bVar15 = (bool)((byte)(uVar35 >> 4) & 1);
            auVar66._16_4_ = (uint)bVar15 * auVar62._16_4_ | (uint)!bVar15 * auVar61._16_4_;
            bVar15 = (bool)((byte)(uVar35 >> 5) & 1);
            auVar66._20_4_ = (uint)bVar15 * auVar62._20_4_ | (uint)!bVar15 * auVar61._20_4_;
            bVar15 = (bool)((byte)(uVar35 >> 6) & 1);
            auVar66._24_4_ = (uint)bVar15 * auVar62._24_4_ | (uint)!bVar15 * auVar61._24_4_;
            bVar15 = (bool)((byte)(uVar35 >> 7) & 1);
            auVar66._28_4_ = (uint)bVar15 * auVar62._28_4_ | (uint)!bVar15 * auVar61._28_4_;
            auVar61 = vpermt2q_avx512vl(auVar59,auVar66,auVar60);
            sVar29 = auVar61._0_8_;
            iVar23 = 0;
            uVar35 = root.ptr - 1 & root.ptr;
            if (uVar35 != 0) {
              auVar61 = vpshufd_avx2(auVar66,0x55);
              vpermt2q_avx512vl(auVar59,auVar61,auVar60);
              auVar62 = vpminsd_avx2(auVar66,auVar61);
              auVar61 = vpmaxsd_avx2(auVar66,auVar61);
              uVar35 = uVar35 - 1 & uVar35;
              if (uVar35 == 0) {
                auVar63 = vpermi2q_avx512vl(auVar62,auVar59,auVar60);
                sVar29 = auVar63._0_8_;
                auVar63 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                (pSVar28->ptr).ptr = auVar63._0_8_;
                auVar63 = vpermd_avx2(auVar61,auVar67);
                pSVar28->dist = auVar63._0_4_;
                pSVar28 = pSVar28 + 1;
              }
              else {
                auVar16 = vpshufd_avx2(auVar66,0xaa);
                vpermt2q_avx512vl(auVar59,auVar16,auVar60);
                auVar70 = vpminsd_avx2(auVar62,auVar16);
                auVar62 = vpmaxsd_avx2(auVar62,auVar16);
                auVar16 = vpminsd_avx2(auVar61,auVar62);
                auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                uVar35 = uVar35 - 1 & uVar35;
                if (uVar35 == 0) {
                  auVar63 = vpermi2q_avx512vl(auVar70,auVar59,auVar60);
                  sVar29 = auVar63._0_8_;
                  auVar63 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                  (pSVar28->ptr).ptr = auVar63._0_8_;
                  auVar63 = vpermd_avx2(auVar61,auVar67);
                  pSVar28->dist = auVar63._0_4_;
                  auVar63 = vpermt2q_avx512vl(auVar59,auVar16,auVar60);
                  pSVar28[1].ptr.ptr = auVar63._0_8_;
                  auVar63 = vpermd_avx2(auVar16,auVar67);
                  pSVar28[1].dist = auVar63._0_4_;
                  pSVar28 = pSVar28 + 2;
                }
                else {
                  auVar64 = vmovdqa64_avx512vl(auVar67);
                  auVar62 = vpshufd_avx2(auVar66,0xff);
                  vpermt2q_avx512vl(auVar59,auVar62,auVar60);
                  auVar67 = vpminsd_avx2(auVar70,auVar62);
                  auVar62 = vpmaxsd_avx2(auVar70,auVar62);
                  auVar70 = vpminsd_avx2(auVar16,auVar62);
                  auVar62 = vpmaxsd_avx2(auVar16,auVar62);
                  auVar16 = vpminsd_avx2(auVar61,auVar62);
                  auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                  uVar35 = uVar35 - 1 & uVar35;
                  if (uVar35 == 0) {
                    auVar62 = vpermi2q_avx512vl(auVar67,auVar59,auVar60);
                    sVar29 = auVar62._0_8_;
                    auVar62 = vpermt2q_avx512vl(auVar59,auVar61,auVar60);
                    (pSVar28->ptr).ptr = auVar62._0_8_;
                    auVar62 = vmovdqa64_avx512vl(auVar64);
                    in_ZMM15 = ZEXT3264(auVar62);
                    auVar61 = vpermd_avx512vl(auVar61,auVar64);
                    pSVar28->dist = auVar61._0_4_;
                    auVar61 = vpermt2q_avx512vl(auVar59,auVar16,auVar60);
                    pSVar28[1].ptr.ptr = auVar61._0_8_;
                    auVar61 = vpermd_avx512vl(auVar16,auVar64);
                    pSVar28[1].dist = auVar61._0_4_;
                    auVar59 = vpermt2q_avx512vl(auVar59,auVar70,auVar60);
                    pSVar28[2].ptr.ptr = auVar59._0_8_;
                    auVar59 = vpermd_avx512vl(auVar70,auVar64);
                    pSVar28[2].dist = auVar59._0_4_;
                    pSVar28 = pSVar28 + 3;
                    auVar101 = ZEXT3264(local_2588);
                    auVar102 = ZEXT3264(local_25a8);
                    auVar103 = ZEXT3264(local_25c8);
                    auVar104 = ZEXT3264(local_25e8);
                    auVar105 = ZEXT3264(local_2608);
                    auVar106 = ZEXT3264(local_2628);
                    auVar96 = ZEXT3264(auVar63);
                    auVar98 = ZEXT3264(auVar97);
                    auVar100 = ZEXT3264(auVar99);
                  }
                  else {
                    auVar65 = valignd_avx512vl(auVar66,auVar66,3);
                    auVar62 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar66 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar62,auVar67);
                    auVar62 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar66 = vpermt2d_avx512vl(auVar66,auVar62,auVar70);
                    auVar66 = vpermt2d_avx512vl(auVar66,auVar62,auVar16);
                    auVar62 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar61 = vpermt2d_avx512vl(auVar66,auVar62,auVar61);
                    auVar96 = ZEXT3264(auVar61);
                    uVar26 = uVar35;
                    do {
                      auVar62 = auVar96._0_32_;
                      auVar70._8_4_ = 1;
                      auVar70._0_8_ = 0x100000001;
                      auVar70._12_4_ = 1;
                      auVar70._16_4_ = 1;
                      auVar70._20_4_ = 1;
                      auVar70._24_4_ = 1;
                      auVar70._28_4_ = 1;
                      auVar61 = vpermd_avx2(auVar70,auVar65);
                      auVar65 = valignd_avx512vl(auVar65,auVar65,1);
                      vpermt2q_avx512vl(auVar59,auVar65,auVar60);
                      uVar26 = uVar26 - 1 & uVar26;
                      uVar18 = vpcmpd_avx512vl(auVar61,auVar62,5);
                      auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                      bVar25 = (byte)uVar18 << 1;
                      auVar62 = valignd_avx512vl(auVar62,auVar62,7);
                      bVar15 = (bool)((byte)uVar18 & 1);
                      auVar67._4_4_ = (uint)bVar15 * auVar62._4_4_ | (uint)!bVar15 * auVar61._4_4_;
                      auVar67._0_4_ = auVar61._0_4_;
                      bVar15 = (bool)(bVar25 >> 2 & 1);
                      auVar67._8_4_ = (uint)bVar15 * auVar62._8_4_ | (uint)!bVar15 * auVar61._8_4_;
                      bVar15 = (bool)(bVar25 >> 3 & 1);
                      auVar67._12_4_ =
                           (uint)bVar15 * auVar62._12_4_ | (uint)!bVar15 * auVar61._12_4_;
                      bVar15 = (bool)(bVar25 >> 4 & 1);
                      auVar67._16_4_ =
                           (uint)bVar15 * auVar62._16_4_ | (uint)!bVar15 * auVar61._16_4_;
                      bVar15 = (bool)(bVar25 >> 5 & 1);
                      auVar67._20_4_ =
                           (uint)bVar15 * auVar62._20_4_ | (uint)!bVar15 * auVar61._20_4_;
                      bVar15 = (bool)(bVar25 >> 6 & 1);
                      auVar67._24_4_ =
                           (uint)bVar15 * auVar62._24_4_ | (uint)!bVar15 * auVar61._24_4_;
                      auVar67._28_4_ =
                           (uint)(bVar25 >> 7) * auVar62._28_4_ |
                           (uint)!(bool)(bVar25 >> 7) * auVar61._28_4_;
                      auVar96 = ZEXT3264(auVar67);
                    } while (uVar26 != 0);
                    lVar24 = POPCOUNT(uVar35) + 3;
                    do {
                      auVar61 = vpermi2q_avx512vl(auVar67,auVar59,auVar60);
                      (pSVar28->ptr).ptr = auVar61._0_8_;
                      auVar62 = auVar96._0_32_;
                      auVar61 = vpermd_avx512vl(auVar62,auVar64);
                      pSVar28->dist = auVar61._0_4_;
                      auVar67 = valignd_avx512vl(auVar62,auVar62,1);
                      pSVar28 = pSVar28 + 1;
                      auVar96 = ZEXT3264(auVar67);
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                    auVar59 = vpermt2q_avx512vl(auVar59,auVar67,auVar60);
                    sVar29 = auVar59._0_8_;
                    auVar101 = ZEXT3264(local_2588);
                    auVar102 = ZEXT3264(local_25a8);
                    auVar103 = ZEXT3264(local_25c8);
                    auVar104 = ZEXT3264(local_25e8);
                    auVar105 = ZEXT3264(local_2608);
                    auVar106 = ZEXT3264(local_2628);
                    auVar96 = ZEXT3264(auVar63);
                    auVar98 = ZEXT3264(auVar97);
                    auVar100 = ZEXT3264(auVar99);
                    auVar63 = vmovdqa64_avx512vl(auVar64);
                    in_ZMM15 = ZEXT3264(auVar63);
                  }
                }
              }
            }
          }
        }
        else {
          iVar23 = 6;
        }
      } while (iVar23 == 0);
    } while (iVar23 != 6);
    local_2398 = in_ZMM15._0_32_;
    local_2688 = (ulong)((uint)sVar29 & 0xf) - 8;
    if (local_2688 != 0) {
      uVar30 = sVar29 & 0xfffffffffffffff0;
      local_2680 = 0;
      do {
        lVar24 = local_2680 * 0x50;
        pSVar5 = context->scene;
        ppfVar6 = (pSVar5->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar30 + 0x30 + lVar24)];
        pfVar8 = ppfVar6[*(uint *)(uVar30 + 0x34 + lVar24)];
        pfVar9 = ppfVar6[*(uint *)(uVar30 + 0x38 + lVar24)];
        pfVar10 = ppfVar6[*(uint *)(uVar30 + 0x3c + lVar24)];
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 8 + lVar24)));
        auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 8 + lVar24)));
        auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 4 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0xc + lVar24)));
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 4 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0xc + lVar24)));
        auVar51 = vunpcklps_avx(auVar57,auVar58);
        auVar38 = vunpcklps_avx(auVar56,auVar55);
        auVar58 = vunpckhps_avx(auVar56,auVar55);
        auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x10 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 0x18 + lVar24)));
        auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x10 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 0x18 + lVar24)));
        auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 0x14 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0x1c + lVar24)))
        ;
        auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 0x14 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0x1c + lVar24)))
        ;
        auVar40 = vunpcklps_avx(auVar57,auVar56);
        auVar39 = vunpcklps_avx(auVar55,auVar37);
        auVar55 = vunpckhps_avx(auVar55,auVar37);
        auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x20 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 0x28 + lVar24)));
        auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x20 + lVar24)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar30 + 0x28 + lVar24)));
        auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 0x24 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0x2c + lVar24)))
        ;
        auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar30 + 0x24 + lVar24)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar30 + 0x2c + lVar24)))
        ;
        auVar42 = vunpcklps_avx(auVar57,auVar56);
        puVar1 = (undefined8 *)(uVar30 + 0x30 + lVar24);
        local_24b8 = *puVar1;
        uStack_24b0 = puVar1[1];
        puVar1 = (undefined8 *)(uVar30 + 0x40 + lVar24);
        local_2638 = *puVar1;
        uStack_2630 = puVar1[1];
        auVar43 = vunpcklps_avx(auVar37,auVar41);
        local_2538 = &mapUV;
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar44._4_4_ = uVar2;
        auVar44._0_4_ = uVar2;
        auVar44._8_4_ = uVar2;
        auVar44._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar45._4_4_ = uVar2;
        auVar45._0_4_ = uVar2;
        auVar45._8_4_ = uVar2;
        auVar45._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar46._4_4_ = uVar2;
        auVar46._0_4_ = uVar2;
        auVar46._8_4_ = uVar2;
        auVar46._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar71._4_4_ = uVar2;
        auVar71._0_4_ = uVar2;
        auVar71._8_4_ = uVar2;
        auVar71._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar72._4_4_ = uVar2;
        auVar72._0_4_ = uVar2;
        auVar72._8_4_ = uVar2;
        auVar72._12_4_ = uVar2;
        auVar37 = vunpckhps_avx512vl(auVar37,auVar41);
        fVar73 = *(float *)(ray + k * 4 + 0x60);
        auVar89._4_4_ = fVar73;
        auVar89._0_4_ = fVar73;
        auVar89._8_4_ = fVar73;
        auVar89._12_4_ = fVar73;
        auVar57 = vsubps_avx(auVar38,auVar44);
        auVar58 = vsubps_avx(auVar58,auVar45);
        auVar56 = vsubps_avx(auVar51,auVar46);
        auVar38 = vsubps_avx512vl(auVar39,auVar44);
        auVar39 = vsubps_avx512vl(auVar55,auVar45);
        auVar40 = vsubps_avx512vl(auVar40,auVar46);
        auVar41 = vsubps_avx512vl(auVar43,auVar44);
        auVar37 = vsubps_avx512vl(auVar37,auVar45);
        auVar42 = vsubps_avx512vl(auVar42,auVar46);
        auVar43 = vsubps_avx512vl(auVar41,auVar57);
        auVar55 = vsubps_avx(auVar37,auVar58);
        auVar44 = vsubps_avx512vl(auVar42,auVar56);
        auVar45 = vsubps_avx512vl(auVar57,auVar38);
        auVar46 = vsubps_avx512vl(auVar58,auVar39);
        auVar47 = vsubps_avx512vl(auVar56,auVar40);
        auVar48 = vsubps_avx512vl(auVar38,auVar41);
        auVar49 = vsubps_avx512vl(auVar39,auVar37);
        auVar50 = vsubps_avx512vl(auVar40,auVar42);
        auVar51 = vaddps_avx512vl(auVar41,auVar57);
        auVar81._0_4_ = auVar37._0_4_ + auVar58._0_4_;
        auVar81._4_4_ = auVar37._4_4_ + auVar58._4_4_;
        auVar81._8_4_ = auVar37._8_4_ + auVar58._8_4_;
        auVar81._12_4_ = auVar37._12_4_ + auVar58._12_4_;
        auVar52 = vaddps_avx512vl(auVar42,auVar56);
        auVar53 = vmulps_avx512vl(auVar81,auVar44);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar55,auVar52);
        auVar52 = vmulps_avx512vl(auVar52,auVar43);
        auVar52 = vfmsub231ps_avx512vl(auVar52,auVar44,auVar51);
        auVar54._0_4_ = auVar55._0_4_ * auVar51._0_4_;
        auVar54._4_4_ = auVar55._4_4_ * auVar51._4_4_;
        auVar54._8_4_ = auVar55._8_4_ * auVar51._8_4_;
        auVar54._12_4_ = auVar55._12_4_ * auVar51._12_4_;
        auVar51 = vfmsub231ps_fma(auVar54,auVar43,auVar81);
        auVar69._0_4_ = fVar73 * auVar51._0_4_;
        auVar69._4_4_ = fVar73 * auVar51._4_4_;
        auVar69._8_4_ = fVar73 * auVar51._8_4_;
        auVar69._12_4_ = fVar73 * auVar51._12_4_;
        auVar51 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar52);
        local_2568 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar53);
        auVar51 = vaddps_avx512vl(auVar57,auVar38);
        auVar52 = vaddps_avx512vl(auVar58,auVar39);
        auVar53 = vaddps_avx512vl(auVar56,auVar40);
        auVar54 = vmulps_avx512vl(auVar52,auVar47);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar46,auVar53);
        auVar53 = vmulps_avx512vl(auVar53,auVar45);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar47,auVar51);
        auVar51 = vmulps_avx512vl(auVar51,auVar46);
        auVar51 = vfmsub231ps_avx512vl(auVar51,auVar45,auVar52);
        auVar52._0_4_ = auVar51._0_4_ * fVar73;
        auVar52._4_4_ = auVar51._4_4_ * fVar73;
        auVar52._8_4_ = auVar51._8_4_ * fVar73;
        auVar52._12_4_ = auVar51._12_4_ * fVar73;
        auVar51 = vfmadd231ps_avx512vl(auVar52,auVar72,auVar53);
        local_2558 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar54);
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar68 = ZEXT1664(auVar52);
        auVar51 = vaddps_avx512vl(auVar38,auVar41);
        auVar38 = vaddps_avx512vl(auVar39,auVar37);
        auVar37 = vaddps_avx512vl(auVar40,auVar42);
        auVar40 = vmulps_avx512vl(auVar38,auVar50);
        auVar40 = vfmsub231ps_avx512vl(auVar40,auVar49,auVar37);
        auVar37 = vmulps_avx512vl(auVar37,auVar48);
        auVar37 = vfmsub231ps_avx512vl(auVar37,auVar50,auVar51);
        auVar51 = vmulps_avx512vl(auVar51,auVar49);
        auVar51 = vfmsub231ps_avx512vl(auVar51,auVar48,auVar38);
        auVar51 = vmulps_avx512vl(auVar51,auVar89);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar72,auVar37);
        auVar37 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar40);
        auVar40._0_4_ = local_2558._0_4_ + local_2568._0_4_;
        auVar40._4_4_ = local_2558._4_4_ + local_2568._4_4_;
        auVar40._8_4_ = local_2558._8_4_ + local_2568._8_4_;
        auVar40._12_4_ = local_2558._12_4_ + local_2568._12_4_;
        local_2548 = vaddps_avx512vl(auVar37,auVar40);
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar51 = vandps_avx512vl(local_2548,auVar51);
        auVar38._8_4_ = 0x34000000;
        auVar38._0_8_ = 0x3400000034000000;
        auVar38._12_4_ = 0x34000000;
        auVar38 = vmulps_avx512vl(auVar51,auVar38);
        auVar40 = vminps_avx512vl(local_2568,local_2558);
        auVar40 = vminps_avx512vl(auVar40,auVar37);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar39 = vxorps_avx512vl(auVar38,auVar39);
        uVar18 = vcmpps_avx512vl(auVar40,auVar39,5);
        auVar40 = vmaxps_avx512vl(local_2568,local_2558);
        auVar37 = vmaxps_avx512vl(auVar40,auVar37);
        uVar17 = vcmpps_avx512vl(auVar37,auVar38,2);
        local_2530 = ((byte)uVar18 | (byte)uVar17) & 0xf;
        if (local_2530 != 0) {
          auVar38 = vmulps_avx512vl(auVar46,auVar44);
          auVar37 = vmulps_avx512vl(auVar43,auVar47);
          auVar40 = vmulps_avx512vl(auVar45,auVar55);
          auVar39 = vmulps_avx512vl(auVar49,auVar47);
          auVar41 = vmulps_avx512vl(auVar45,auVar50);
          auVar42 = vmulps_avx512vl(auVar48,auVar46);
          auVar55 = vfmsub213ps_avx512vl(auVar55,auVar47,auVar38);
          auVar44 = vfmsub213ps_avx512vl(auVar44,auVar45,auVar37);
          auVar43 = vfmsub213ps_avx512vl(auVar43,auVar46,auVar40);
          auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar39);
          auVar47 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar41);
          auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar42);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar38 = vandps_avx512vl(auVar38,auVar48);
          auVar39 = vandps_avx512vl(auVar39,auVar48);
          uVar27 = vcmpps_avx512vl(auVar38,auVar39,1);
          auVar38 = vandps_avx512vl(auVar37,auVar48);
          auVar37 = vandps_avx512vl(auVar41,auVar48);
          uVar36 = vcmpps_avx512vl(auVar38,auVar37,1);
          auVar38 = vandps_avx512vl(auVar40,auVar48);
          auVar37 = vandps_avx512vl(auVar42,auVar48);
          uVar31 = vcmpps_avx512vl(auVar38,auVar37,1);
          bVar15 = (bool)((byte)uVar27 & 1);
          local_24f8._0_4_ = (uint)bVar15 * auVar55._0_4_ | (uint)!bVar15 * auVar46._0_4_;
          bVar15 = (bool)((byte)(uVar27 >> 1) & 1);
          local_24f8._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar46._4_4_;
          bVar15 = (bool)((byte)(uVar27 >> 2) & 1);
          local_24f8._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar46._8_4_;
          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
          local_24f8._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar46._12_4_;
          bVar15 = (bool)((byte)uVar36 & 1);
          local_24e8._0_4_ = (uint)bVar15 * auVar44._0_4_ | (uint)!bVar15 * auVar47._0_4_;
          bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
          local_24e8._4_4_ = (uint)bVar15 * auVar44._4_4_ | (uint)!bVar15 * auVar47._4_4_;
          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
          local_24e8._8_4_ = (uint)bVar15 * auVar44._8_4_ | (uint)!bVar15 * auVar47._8_4_;
          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
          local_24e8._12_4_ = (uint)bVar15 * auVar44._12_4_ | (uint)!bVar15 * auVar47._12_4_;
          bVar15 = (bool)((byte)uVar31 & 1);
          local_24d8[0] = (float)((uint)bVar15 * auVar43._0_4_ | (uint)!bVar15 * auVar45._0_4_);
          bVar15 = (bool)((byte)(uVar31 >> 1) & 1);
          local_24d8[1] = (float)((uint)bVar15 * auVar43._4_4_ | (uint)!bVar15 * auVar45._4_4_);
          bVar15 = (bool)((byte)(uVar31 >> 2) & 1);
          local_24d8[2] = (float)((uint)bVar15 * auVar43._8_4_ | (uint)!bVar15 * auVar45._8_4_);
          bVar15 = (bool)((byte)(uVar31 >> 3) & 1);
          local_24d8[3] = (float)((uint)bVar15 * auVar43._12_4_ | (uint)!bVar15 * auVar45._12_4_);
          auVar39._0_4_ = fVar73 * local_24d8[0];
          auVar39._4_4_ = fVar73 * local_24d8[1];
          auVar39._8_4_ = fVar73 * local_24d8[2];
          auVar39._12_4_ = fVar73 * local_24d8[3];
          auVar55 = vfmadd213ps_fma(auVar72,local_24e8,auVar39);
          auVar55 = vfmadd213ps_fma(auVar71,local_24f8,auVar55);
          auVar37._0_4_ = auVar55._0_4_ + auVar55._0_4_;
          auVar37._4_4_ = auVar55._4_4_ + auVar55._4_4_;
          auVar37._8_4_ = auVar55._8_4_ + auVar55._8_4_;
          auVar37._12_4_ = auVar55._12_4_ + auVar55._12_4_;
          auVar55._0_4_ = auVar56._0_4_ * local_24d8[0];
          auVar55._4_4_ = auVar56._4_4_ * local_24d8[1];
          auVar55._8_4_ = auVar56._8_4_ * local_24d8[2];
          auVar55._12_4_ = auVar56._12_4_ * local_24d8[3];
          auVar58 = vfmadd213ps_fma(auVar58,local_24e8,auVar55);
          auVar58 = vfmadd213ps_fma(auVar57,local_24f8,auVar58);
          auVar56 = vrcp14ps_avx512vl(auVar37);
          auVar57._8_4_ = 0x3f800000;
          auVar57._0_8_ = &DAT_3f8000003f800000;
          auVar57._12_4_ = 0x3f800000;
          auVar57 = vfnmadd213ps_avx512vl(auVar56,auVar37,auVar57);
          auVar57 = vfmadd132ps_fma(auVar57,auVar56,auVar56);
          local_2508._0_4_ = (auVar58._0_4_ + auVar58._0_4_) * auVar57._0_4_;
          local_2508._4_4_ = (auVar58._4_4_ + auVar58._4_4_) * auVar57._4_4_;
          local_2508._8_4_ = (auVar58._8_4_ + auVar58._8_4_) * auVar57._8_4_;
          local_2508._12_4_ = (auVar58._12_4_ + auVar58._12_4_) * auVar57._12_4_;
          auVar96 = ZEXT1664(local_2508);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar58._4_4_ = uVar2;
          auVar58._0_4_ = uVar2;
          auVar58._8_4_ = uVar2;
          auVar58._12_4_ = uVar2;
          uVar18 = vcmpps_avx512vl(local_2508,auVar58,2);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar56._4_4_ = uVar2;
          auVar56._0_4_ = uVar2;
          auVar56._8_4_ = uVar2;
          auVar56._12_4_ = uVar2;
          uVar17 = vcmpps_avx512vl(local_2508,auVar56,0xd);
          local_2530 = (byte)uVar18 & (byte)uVar17 & local_2530;
          if (local_2530 != 0) {
            uVar18 = vcmpps_avx512vl(auVar37,_DAT_01feba10,4);
            local_2530 = local_2530 & (byte)uVar18;
            uVar34 = (uint)local_2530;
            if (local_2530 != 0) {
              auVar41._8_4_ = 0x219392ef;
              auVar41._0_8_ = 0x219392ef219392ef;
              auVar41._12_4_ = 0x219392ef;
              uVar27 = vcmpps_avx512vl(auVar51,auVar41,5);
              auVar58 = vrcp14ps_avx512vl(local_2548);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = &DAT_3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar57 = vfnmadd213ps_fma(local_2548,auVar58,auVar48);
              auVar57 = vfmadd132ps_avx512vl(auVar57,auVar58,auVar58);
              fVar76 = (float)((uint)((byte)uVar27 & 1) * auVar57._0_4_);
              fVar75 = (float)((uint)((byte)(uVar27 >> 1) & 1) * auVar57._4_4_);
              fVar74 = (float)((uint)((byte)(uVar27 >> 2) & 1) * auVar57._8_4_);
              fVar73 = (float)((uint)((byte)(uVar27 >> 3) & 1) * auVar57._12_4_);
              auVar43._0_4_ = fVar76 * local_2568._0_4_;
              auVar43._4_4_ = fVar75 * local_2568._4_4_;
              auVar43._8_4_ = fVar74 * local_2568._8_4_;
              auVar43._12_4_ = fVar73 * local_2568._12_4_;
              local_2528 = vminps_avx(auVar43,auVar48);
              auVar47._0_4_ = fVar76 * local_2558._0_4_;
              auVar47._4_4_ = fVar75 * local_2558._4_4_;
              auVar47._8_4_ = fVar74 * local_2558._8_4_;
              auVar47._12_4_ = fVar73 * local_2558._12_4_;
              local_2518 = vminps_avx(auVar47,auVar48);
              auVar57 = vblendmps_avx512vl(auVar52,local_2508);
              auVar42._0_4_ =
                   (uint)(local_2530 & 1) * auVar57._0_4_ |
                   (uint)!(bool)(local_2530 & 1) * local_2518._0_4_;
              bVar15 = (bool)(local_2530 >> 1 & 1);
              auVar42._4_4_ = (uint)bVar15 * auVar57._4_4_ | (uint)!bVar15 * local_2518._4_4_;
              bVar15 = (bool)(local_2530 >> 2 & 1);
              auVar42._8_4_ = (uint)bVar15 * auVar57._8_4_ | (uint)!bVar15 * local_2518._8_4_;
              auVar42._12_4_ =
                   (uint)(local_2530 >> 3) * auVar57._12_4_ |
                   (uint)!(bool)(local_2530 >> 3) * local_2518._12_4_;
              auVar57 = vshufps_avx(auVar42,auVar42,0xb1);
              auVar57 = vminps_avx(auVar57,auVar42);
              auVar58 = vshufpd_avx(auVar57,auVar57,1);
              auVar57 = vminps_avx(auVar58,auVar57);
              uVar18 = vcmpps_avx512vl(auVar42,auVar57,0);
              bVar25 = (byte)uVar18 & local_2530;
              if (((byte)uVar18 & local_2530) == 0) {
                bVar25 = local_2530;
              }
              uVar27 = 0;
              for (uVar36 = (ulong)bVar25; (uVar36 & 1) == 0;
                  uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                uVar27 = uVar27 + 1;
              }
              do {
                uVar4 = *(uint *)((long)&local_24b8 + uVar27 * 4);
                pGVar11 = (pSVar5->geometries).items[uVar4].ptr;
                auVar57 = auVar42;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar25 = ~(byte)(1 << ((uint)uVar27 & 0x1f)) & (byte)uVar34;
LAB_0083b59a:
                  uVar34 = (uint)bVar25;
                  bVar15 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar2 = *(undefined4 *)(local_2528 + uVar27 * 4);
                    local_2478._4_4_ = uVar2;
                    local_2478._0_4_ = uVar2;
                    local_2478._8_4_ = uVar2;
                    local_2478._12_4_ = uVar2;
                    local_2468 = *(undefined4 *)(local_2518 + uVar27 * 4);
                    local_2448 = vpbroadcastd_avx512vl();
                    uVar2 = *(undefined4 *)((long)&local_2638 + uVar27 * 4);
                    local_2458._4_4_ = uVar2;
                    local_2458._0_4_ = uVar2;
                    local_2458._8_4_ = uVar2;
                    local_2458._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_24f8 + uVar27 * 4);
                    fVar73 = local_24d8[uVar27 - 4];
                    local_2498._4_4_ = fVar73;
                    local_2498._0_4_ = fVar73;
                    local_2498._8_4_ = fVar73;
                    local_2498._12_4_ = fVar73;
                    fVar73 = local_24d8[uVar27];
                    local_2488._4_4_ = fVar73;
                    local_2488._0_4_ = fVar73;
                    local_2488._8_4_ = fVar73;
                    local_2488._12_4_ = fVar73;
                    local_24a8[0] = (RTCHitN)(char)uVar2;
                    local_24a8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_24a8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_24a8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_24a8[4] = (RTCHitN)(char)uVar2;
                    local_24a8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_24a8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_24a8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_24a8[8] = (RTCHitN)(char)uVar2;
                    local_24a8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_24a8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_24a8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_24a8[0xc] = (RTCHitN)(char)uVar2;
                    local_24a8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_24a8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_24a8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    uStack_2464 = local_2468;
                    uStack_2460 = local_2468;
                    uStack_245c = local_2468;
                    vpcmpeqd_avx2(ZEXT1632(local_2478),ZEXT1632(local_2478));
                    uStack_2434 = context->user->instID[0];
                    local_2438 = uStack_2434;
                    uStack_2430 = uStack_2434;
                    uStack_242c = uStack_2434;
                    uStack_2428 = context->user->instPrimID[0];
                    uStack_2424 = uStack_2428;
                    uStack_2420 = uStack_2428;
                    uStack_241c = uStack_2428;
                    uVar19 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2508 + uVar27 * 4);
                    local_26d8 = local_24c8._0_8_;
                    uStack_26d0 = local_24c8._8_8_;
                    args.valid = (int *)&local_26d8;
                    args.geometryUserPtr = pGVar11->userPtr;
                    args.context = context->user;
                    args.hit = local_24a8;
                    args.N = 4;
                    auVar57 = auVar96._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_26c0 = pSVar28;
                      (*pGVar11->intersectionFilterN)(&args);
                      auVar96 = ZEXT1664(auVar57);
                      auVar106 = ZEXT3264(local_2628);
                      auVar105 = ZEXT3264(local_2608);
                      auVar104 = ZEXT3264(local_25e8);
                      auVar103 = ZEXT3264(local_25c8);
                      auVar102 = ZEXT3264(local_25a8);
                      auVar101 = ZEXT3264(local_2588);
                      pSVar28 = local_26c0;
                    }
                    auVar49._8_8_ = uStack_26d0;
                    auVar49._0_8_ = local_26d8;
                    uVar36 = vptestmd_avx512vl(auVar49,auVar49);
                    if ((uVar36 & 0xf) == 0) {
LAB_0083b8b6:
                      auVar57 = ZEXT416(uVar19);
                      *(uint *)(ray + k * 4 + 0x80) = uVar19;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&args);
                        auVar96 = ZEXT1664(auVar57);
                        auVar106 = ZEXT3264(local_2628);
                        auVar105 = ZEXT3264(local_2608);
                        auVar104 = ZEXT3264(local_25e8);
                        auVar103 = ZEXT3264(local_25c8);
                        auVar102 = ZEXT3264(local_25a8);
                        auVar101 = ZEXT3264(local_2588);
                      }
                      auVar50._8_8_ = uStack_26d0;
                      auVar50._0_8_ = local_26d8;
                      uVar36 = vptestmd_avx512vl(auVar50,auVar50);
                      uVar36 = uVar36 & 0xf;
                      bVar25 = (byte)uVar36;
                      if (bVar25 == 0) goto LAB_0083b8b6;
                      iVar23 = *(int *)(args.hit + 4);
                      iVar20 = *(int *)(args.hit + 8);
                      iVar21 = *(int *)(args.hit + 0xc);
                      bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar14 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar25 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar15 * iVar23 | (uint)!bVar15 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar13 * iVar20 | (uint)!bVar13 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar14 * iVar21 | (uint)!bVar14 * *(int *)(args.ray + 0xcc);
                      iVar23 = *(int *)(args.hit + 0x14);
                      iVar20 = *(int *)(args.hit + 0x18);
                      iVar21 = *(int *)(args.hit + 0x1c);
                      bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar14 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar15 * iVar23 | (uint)!bVar15 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar13 * iVar20 | (uint)!bVar13 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar14 * iVar21 | (uint)!bVar14 * *(int *)(args.ray + 0xdc);
                      iVar23 = *(int *)(args.hit + 0x24);
                      iVar20 = *(int *)(args.hit + 0x28);
                      iVar21 = *(int *)(args.hit + 0x2c);
                      bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar14 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar15 * iVar23 | (uint)!bVar15 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar13 * iVar20 | (uint)!bVar13 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar14 * iVar21 | (uint)!bVar14 * *(int *)(args.ray + 0xec);
                      iVar23 = *(int *)(args.hit + 0x34);
                      iVar20 = *(int *)(args.hit + 0x38);
                      iVar21 = *(int *)(args.hit + 0x3c);
                      bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar14 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar15 * iVar23 | (uint)!bVar15 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar13 * iVar20 | (uint)!bVar13 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar14 * iVar21 | (uint)!bVar14 * *(int *)(args.ray + 0xfc);
                      iVar23 = *(int *)(args.hit + 0x44);
                      iVar20 = *(int *)(args.hit + 0x48);
                      iVar21 = *(int *)(args.hit + 0x4c);
                      bVar15 = (bool)((byte)(uVar36 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
                      bVar14 = SUB81(uVar36 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar25 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar25 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar15 * iVar23 | (uint)!bVar15 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar13 * iVar20 | (uint)!bVar13 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar14 * iVar21 | (uint)!bVar14 * *(int *)(args.ray + 0x10c);
                      auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar57;
                      auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar57;
                      auVar57 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar57;
                      auVar57 = *(undefined1 (*) [16])(args.hit + 0x80);
                      auVar58 = vmovdqa32_avx512vl(auVar57);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                    }
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar68 = ZEXT1664(auVar58);
                    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar53._4_4_ = uVar2;
                    auVar53._0_4_ = uVar2;
                    auVar53._8_4_ = uVar2;
                    auVar53._12_4_ = uVar2;
                    uVar18 = vcmpps_avx512vl(auVar96._0_16_,auVar53,2);
                    bVar25 = ~(byte)(1 << ((uint)uVar27 & 0x1f)) & (byte)uVar34 & (byte)uVar18;
                    goto LAB_0083b59a;
                  }
                  bVar15 = false;
                }
                if (!bVar15) {
                  uVar2 = *(undefined4 *)(local_2528 + uVar27 * 4);
                  uVar3 = *(undefined4 *)(local_2518 + uVar27 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2508 + uVar27 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_24f8 + uVar27 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_24d8[uVar27 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_24d8[uVar27];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_2638 + uVar27 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar4;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar25 = (byte)uVar34;
                if (bVar25 == 0) break;
                auVar58 = vblendmps_avx512vl(auVar68._0_16_,auVar96._0_16_);
                auVar42._0_4_ =
                     (uint)(bVar25 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar57._0_4_;
                bVar15 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar15 * auVar58._4_4_ | (uint)!bVar15 * auVar57._4_4_;
                bVar15 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar15 * auVar58._8_4_ | (uint)!bVar15 * auVar57._8_4_;
                auVar42._12_4_ =
                     (uVar34 >> 3) * auVar58._12_4_ | (uint)!SUB41(uVar34 >> 3,0) * auVar57._12_4_;
                auVar57 = vshufps_avx(auVar42,auVar42,0xb1);
                auVar57 = vminps_avx(auVar57,auVar42);
                auVar58 = vshufpd_avx(auVar57,auVar57,1);
                auVar57 = vminps_avx(auVar58,auVar57);
                uVar18 = vcmpps_avx512vl(auVar42,auVar57,0);
                bVar25 = (byte)uVar18 & bVar25;
                uVar4 = uVar34;
                if (bVar25 != 0) {
                  uVar4 = (uint)bVar25;
                }
                uVar19 = 0;
                for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
                  uVar19 = uVar19 + 1;
                }
                uVar27 = (ulong)uVar19;
              } while( true );
            }
          }
        }
        local_2680 = local_2680 + 1;
      } while (local_2680 != local_2688);
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar68 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
    auVar96 = ZEXT3264(local_2418);
    auVar63 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar98 = ZEXT3264(auVar63);
    auVar100 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    in_ZMM15 = ZEXT3264(local_2398);
    uVar30 = local_26a0;
    uVar27 = local_2690;
    uVar36 = local_2698;
    uVar31 = local_26b8;
    uVar32 = local_26a8;
    uVar33 = local_26b0;
    fVar73 = local_23b8;
    fVar74 = fStack_23b4;
    fVar75 = fStack_23b0;
    fVar76 = fStack_23ac;
    fVar77 = fStack_23a8;
    fVar78 = fStack_23a4;
    fVar79 = fStack_23a0;
    fVar80 = local_23d8;
    fVar82 = fStack_23d4;
    fVar83 = fStack_23d0;
    fVar84 = fStack_23cc;
    fVar85 = fStack_23c8;
    fVar86 = fStack_23c4;
    fVar87 = fStack_23c0;
    fVar88 = local_23f8;
    fVar90 = fStack_23f4;
    fVar91 = fStack_23f0;
    fVar92 = fStack_23ec;
    fVar93 = fStack_23e8;
    fVar94 = fStack_23e4;
    fVar95 = fStack_23e0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }